

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O1

ostream * embree::emitXML(ostream *cout,Ref<embree::XML> *xml,size_t depth)

{
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  XML *pXVar5;
  long lVar6;
  pointer pTVar7;
  char *pcVar8;
  pointer pRVar9;
  _Self __tmp;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  cVar1 = (char)cout;
  if (depth == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"<?xml version=\"1.0\"?>",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  lVar6 = depth * 2;
  for (lVar10 = lVar6; lVar10 != 0; lVar10 = lVar10 + -1) {
    std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (cout,(xml->ptr->name)._M_dataplus._M_p,(xml->ptr->name)._M_string_length);
  pXVar5 = xml->ptr;
  p_Var4 = (pXVar5->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var4 != &(pXVar5->parms)._M_t._M_impl.super__Rb_tree_header) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(p_Var4 + 2),(long)p_Var4[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      pXVar5 = xml->ptr;
    } while ((_Rb_tree_header *)p_Var4 != &(pXVar5->parms)._M_t._M_impl.super__Rb_tree_header);
  }
  if (((pXVar5->children).
       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (pXVar5->children).
       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     ((pXVar5->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (pXVar5->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"/>",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    return cout;
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,">",1);
  pXVar5 = xml->ptr;
  if ((ulong)(((long)(pXVar5->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pXVar5->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 0x10) {
    bVar12 = (pXVar5->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (pXVar5->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    bVar12 = false;
  }
  if (!bVar12) {
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  if ((xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (!bVar12) {
      for (lVar10 = depth * 2 + 2; lVar10 != 0; lVar10 = lVar10 + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
      }
    }
    pTVar7 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar7) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        poVar3 = operator<<(cout,(Token *)((long)&pTVar7->ty + lVar10));
        bVar13 = uVar11 != ((long)(xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x71c71c71c71c71c7 - 1U;
        pcVar8 = "";
        if (bVar13) {
          pcVar8 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,(ulong)bVar13);
        uVar11 = uVar11 + 1;
        pTVar7 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x48;
      } while (uVar11 < (ulong)(((long)(xml->ptr->body).
                                       super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >>
                                3) * -0x71c71c71c71c71c7));
    }
    if (!bVar12) {
      std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
    }
  }
  pRVar9 = (xml->ptr->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((xml->ptr->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar9) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      emitXML(cout,(Ref<embree::XML> *)((long)&pRVar9->ptr + lVar10),depth + 1);
      uVar11 = uVar11 + 1;
      pRVar9 = (xml->ptr->children).
               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 8;
    } while (uVar11 < (ulong)((long)(xml->ptr->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3))
    ;
  }
  if (lVar6 != 0 && !bVar12) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"</",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (cout,(xml->ptr->name)._M_dataplus._M_p,(xml->ptr->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  return poVar3;
}

Assistant:

std::ostream& emitXML(std::ostream& cout, const Ref<XML>& xml, size_t depth = 0)
  {
    /* print header */
    if (depth == 0) cout << "<?xml version=\"1.0\"?>" << std::endl << std::endl;

    /* print tag opening */
    indent(cout,depth); cout << "<" << xml->name;
    for (std::map<std::string,std::string>::const_iterator i=xml->parms.begin(); i!=xml->parms.end(); i++)
      cout << " " << i->first << "=" << "\"" << i->second << "\"";
    if (xml->children.size() == 0 && xml->body.size() == 0) {
      cout << "/>" << std::endl;
      return cout;
    }
    cout << ">";

    bool compact = xml->body.size() < 16 && xml->children.size() == 0;
    if (!compact) cout << std::endl;

    /* print token list */
    if (xml->body.size()) {
      if (!compact) indent(cout,depth+1);
      for (size_t i=0; i<xml->body.size(); i++)
        cout << xml->body[i] << (i!=xml->body.size()-1?" ":"");
      if (!compact) cout << std::endl;
    }

    /* print children */
    for (size_t i=0; i<xml->children.size(); i++)
      emitXML(cout,xml->children[i],depth+1);

    /* print tag closing */
    if (!compact) indent(cout,depth);
    return cout << "</" << xml->name << ">" << std::endl;
  }